

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O3

bool __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConvexHull
          (ConvexHullProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  Polygon2D *this_00;
  double *pdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double dVar4;
  void *pvVar5;
  long lVar6;
  pointer pVVar7;
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  iterator iVar11;
  pointer pPVar12;
  VectorFixSize<2U> *pVVar13;
  ulong uVar14;
  pointer pPVar15;
  pointer pPVar16;
  double dVar17;
  double dVar18;
  uint uVar19;
  pointer pPVar20;
  ulong uVar21;
  PointerType ptr;
  long lVar22;
  ulong uVar23;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *pvVar24;
  double *pdVar26;
  pointer pVVar27;
  __normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
  __i;
  VectorFixSize<2U> *pVVar28;
  PointerType ptr_1;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  PointerType ptr_2;
  assign_op<double,_double> local_d9;
  VectorFixSize<2U> *local_d8;
  iterator iStack_d0;
  VectorFixSize<2U> *local_c8;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *local_c0;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> local_b8;
  undefined1 local_98 [56];
  Matrix2x3 *local_60;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_58;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *pvVar25;
  
  local_c0 = absoluteFrame_X_supportFrame;
  iDynTree::Position::operator=(&this->o,originOfPlaneInWorld);
  uVar10 = *(undefined8 *)(xAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->P = *(undefined8 *)xAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x70 = uVar10;
  *(undefined8 *)&this->field_0x78 = *(undefined8 *)(xAxisOfPlaneInWorld + 0x10);
  uVar10 = *(undefined8 *)(yAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->field_0x80 = *(undefined8 *)yAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x88 = uVar10;
  *(undefined8 *)&this->field_0x90 = *(undefined8 *)(yAxisOfPlaneInWorld + 0x10);
  local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (&local_b8,
             ((long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pPVar12 = (supportPolygonsExpressedInSupportFrame->
            super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((supportPolygonsExpressedInSupportFrame->
      super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar12) {
    lVar29 = 0;
    lVar22 = 0;
    uVar30 = 0;
    do {
      Polygon::applyTransform
                ((Polygon *)local_98,
                 (Polygon *)
                 ((long)&(pPVar12->m_vertices).
                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar22),
                 (Transform *)(*(long *)local_c0 + lVar29));
      pvVar5 = *(void **)((long)&((local_b8.
                                   super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_vertices).
                                 super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar22);
      lVar6 = *(long *)((long)&((local_b8.
                                 super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_vertices).
                               super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar22);
      puVar3 = (undefined8 *)
               ((long)&((local_b8.
                         super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_start)->m_vertices).
                       super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar22);
      *puVar3 = local_98._0_8_;
      puVar3[1] = local_98._8_8_;
      *(undefined8 *)
       ((long)&((local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_vertices).
               super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar22) = local_98._16_8_;
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      if ((pvVar5 != (void *)0x0) &&
         (operator_delete(pvVar5,lVar6 - (long)pvVar5), (pointer)local_98._0_8_ != (pointer)0x0)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
      }
      uVar30 = uVar30 + 1;
      pPVar12 = (supportPolygonsExpressedInSupportFrame->
                super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x18;
      lVar29 = lVar29 + 0x60;
    } while (uVar30 < (ulong)(((long)(supportPolygonsExpressedInSupportFrame->
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12 >>
                              3) * -0x5555555555555555));
  }
  local_d8 = (VectorFixSize<2U> *)0x0;
  iStack_d0._M_current = (VectorFixSize<2U> *)0x0;
  local_c8 = (VectorFixSize<2U> *)0x0;
  if (local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar31 = false;
  }
  else {
    local_60 = &this->P;
    pvVar24 = (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x0;
    pPVar12 = local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar20 = local_b8.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    do {
      pPVar15 = pPVar12[(long)pvVar24].m_vertices.
                super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar25 = pvVar24;
      if (pPVar12[(long)pvVar24].m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar15) {
        lVar22 = 0;
        uVar30 = 0;
        local_c0 = pvVar24;
        do {
          iDynTree::Position::operator-((Position *)local_98,pPVar15 + lVar22);
          dVar17 = (double)local_98._16_8_ * *(double *)&this->field_0x78 +
                   *(double *)&this->field_0x70 * (double)local_98._8_8_ +
                   *(double *)&this->P * (double)local_98._0_8_;
          dVar18 = (double)local_98._16_8_ * *(double *)&this->field_0x90 +
                   *(double *)&this->field_0x88 * (double)local_98._8_8_ +
                   *(double *)&this->field_0x80 * (double)local_98._0_8_;
          local_58.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value._0_4_ = SUB84(dVar18,0);
          local_58.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)dVar17;
          local_58.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value._4_4_ = (int)((ulong)dVar18 >> 0x20);
          if (iStack_d0._M_current == local_c8) {
            std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>::
            _M_realloc_insert<iDynTree::VectorFixSize<2u>const&>
                      ((vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>
                        *)&local_d8,iStack_d0,(VectorFixSize<2U> *)&local_58);
          }
          else {
            (iStack_d0._M_current)->m_data[0] = dVar17;
            (iStack_d0._M_current)->m_data[1] =
                 (double)local_58.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          uVar30 = uVar30 + 1;
          pPVar15 = local_b8.
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)pvVar24].m_vertices.
                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar22 = lVar22 + 0x18;
          pPVar12 = local_b8.
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar20 = local_b8.
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pvVar25 = local_c0;
        } while (uVar30 < (ulong)(((long)local_b8.
                                         super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                         ._M_impl.super__Vector_impl_data._M_start[(long)pvVar24].
                                         m_vertices.
                                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar15
                                  >> 3) * -0x5555555555555555));
      }
      iVar11._M_current = (VectorFixSize<2U> *)iStack_d0;
      pVVar13 = local_d8;
      pvVar24 = pvVar25 + 1;
    } while (pvVar24 < (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
                       (((long)pPVar20 - (long)pPVar12 >> 3) * -0x5555555555555555));
    lVar22 = (long)iStack_d0._M_current - (long)local_d8;
    uVar30 = lVar22 >> 4;
    bVar31 = 2 < uVar30;
    if (bVar31) {
      if (local_d8 != iStack_d0._M_current) {
        lVar29 = 0x3f;
        if (uVar30 != 0) {
          for (; uVar30 >> lVar29 == 0; lVar29 = lVar29 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                  (local_d8,iStack_d0._M_current,((uint)lVar29 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar22 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                    (pVVar13,iVar11._M_current);
        }
        else {
          pVVar28 = pVVar13 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                    (pVVar13,pVVar28);
          for (; pVVar28 != iVar11._M_current; pVVar28 = pVVar28 + 1) {
            dVar17 = pVVar28->m_data[0];
            dVar18 = pVVar28->m_data[1];
            pVVar13 = pVVar28;
            while( true ) {
              dVar4 = pVVar13[-1].m_data[0];
              if ((dVar4 <= dVar17) &&
                 (((dVar4 != dVar17 || (NAN(dVar4) || NAN(dVar17))) ||
                  (pVVar13[-1].m_data[1] <= dVar18)))) break;
              dVar4 = pVVar13[-1].m_data[1];
              pVVar13->m_data[0] = pVVar13[-1].m_data[0];
              pVVar13->m_data[1] = dVar4;
              pVVar13 = pVVar13 + -1;
            }
            pVVar13->m_data[0] = dVar17;
            pVVar13->m_data[1] = dVar18;
          }
        }
      }
      this_00 = &this->projectedConvexHull;
      std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
      resize(&this_00->m_vertices,(long)iStack_d0._M_current - (long)local_d8 >> 3);
      if (iStack_d0._M_current == local_d8) {
        uVar21 = 0;
        uVar30 = 0;
      }
      else {
        uVar14 = 0;
        uVar30 = 0;
        do {
          pVVar7 = (this_00->m_vertices).
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar13 = local_d8 + uVar14;
          pdVar26 = pVVar7[uVar30 - 1].m_data + 1;
          uVar21 = uVar30;
          do {
            uVar23 = (ulong)(uVar30 != 0);
            if (uVar21 < 2) break;
            pdVar1 = pdVar26 + -3;
            pdVar2 = pdVar26 + -2;
            pVVar28 = (VectorFixSize<2U> *)(pdVar26 + -1);
            dVar17 = *pdVar26;
            pdVar26 = pdVar26 + -2;
            uVar23 = uVar21;
            uVar21 = uVar21 - 1;
          } while ((pVVar13->m_data[1] - *pdVar2) * (pVVar28->m_data[0] - *pdVar1) -
                   (pVVar13->m_data[0] - *pdVar1) * (dVar17 - *pdVar2) <= 0.0);
          dVar17 = pVVar13->m_data[1];
          pVVar7 = pVVar7 + uVar23;
          pVVar7->m_data[0] = pVVar13->m_data[0];
          pVVar7->m_data[1] = dVar17;
          uVar30 = uVar23 + 1;
          uVar14 = uVar14 + 1;
          uVar21 = (long)iStack_d0._M_current - (long)local_d8 >> 4;
        } while (uVar14 < uVar21);
      }
      uVar19 = (int)uVar21 - 2;
      if (-1 < (int)uVar19) {
        iVar9 = (int)uVar30;
        uVar21 = (ulong)uVar19;
        do {
          pVVar13 = local_d8 + uVar21;
          pVVar7 = (this_00->m_vertices).
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar30;
          do {
            pVVar27 = pVVar7;
            uVar14 = uVar30;
            if (uVar14 < (ulong)(long)(iVar9 + 1)) break;
            uVar30 = uVar14 - 1;
            pVVar7 = pVVar27 + -1;
          } while ((pVVar13->m_data[1] - pVVar27[-2].m_data[1]) *
                   (pVVar27[-1].m_data[0] - pVVar27[-2].m_data[0]) -
                   (pVVar13->m_data[0] - pVVar27[-2].m_data[0]) *
                   (pVVar27[-1].m_data[1] - pVVar27[-2].m_data[1]) <= 0.0);
          dVar17 = pVVar13->m_data[1];
          pVVar27->m_data[0] = pVVar13->m_data[0];
          pVVar27->m_data[1] = dVar17;
          uVar30 = uVar14 + 1;
          bVar8 = 0 < (long)uVar21;
          uVar21 = uVar21 - 1;
        } while (bVar8);
        uVar30 = uVar14 + 1;
      }
      std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
      resize(&this_00->m_vertices,uVar30 - 1);
      buildConstraintMatrix(this);
      uVar30 = iDynTree::MatrixDynSize::rows();
      iDynTree::MatrixDynSize::resize((ulong)&this->AtimesP,uVar30);
      pPVar15 = (pointer)iDynTree::MatrixDynSize::data();
      pPVar16 = (pointer)iDynTree::MatrixDynSize::rows();
      local_98._16_8_ = iDynTree::MatrixDynSize::cols();
      local_98._32_8_ = local_60;
      local_98._0_8_ = pPVar15;
      local_98._8_8_ = pPVar16;
      dVar17 = (double)iDynTree::MatrixDynSize::data();
      dVar18 = (double)iDynTree::MatrixDynSize::rows();
      local_58.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_58.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)dVar18;
      local_58.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (PointerType)dVar17;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
                (&local_58,
                 (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)local_98,&local_d9,(type)0x0);
    }
    if (local_d8 != (VectorFixSize<2U> *)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
  }
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector(&local_b8);
  return bVar31;
}

Assistant:

bool ConvexHullProjectionConstraint::buildConvexHull(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
        o = originOfPlaneInWorld;
        toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
        toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

        // Transform the polygons in the absolute frame
        std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

        supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

        for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
        {
            supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
        }

        // Project the polygons on the projection plane
        std::vector<Vector2> projectedPoints;

        for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
        {
            for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
            {
                 Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
                 //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
                 projectedPoints.push_back(newProjectedPoint);
            }
        }

        if (projectedPoints.size() <= 2)
        {
            return false;
        }

        // Compute the convex hull using the Monotone Chain

        // Order the projected points with a lexographical ordering
        struct
        {
            bool operator()(Vector2 a, Vector2 b)
            {
                return (a(0) < b(0)) || ( (a(0) == b(0)) && (a(1) < b(1)) );
            }
        } vector2lexographical;

        std::sort(projectedPoints.begin(), projectedPoints.end(), vector2lexographical);

        // Reset the convex hull (it will be properly resized after running the algorithm
        projectedConvexHull.m_vertices.resize(2*projectedPoints.size());
        size_t k = 0;

        // Build the upper hull
        for (int i = 0; i < projectedPoints.size(); ++i)
        {
            while (k >= 2 && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;

        }

        // Build the lower hull
        for (int i = projectedPoints.size()-2, t = k+1; i >= 0; i--)
        {
            while (k >= t && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;
        }

        projectedConvexHull.m_vertices.resize(k-1);

        // Build the constraint matrix
        buildConstraintMatrix();

        // Update AtimesP matrix
        AtimesP.resize(A.rows(),P.cols());

        toEigen(AtimesP) = toEigen(A)*toEigen(P);

        return true;
    }